

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateImplementation.cpp
# Opt level: O2

double Js::ConvertToInteger(double dbl)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint32 *puVar4;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar5 [16];
  undefined1 extraout_XMM0_00 [16];
  double local_18;
  double dbl_local;
  
  local_18 = dbl;
  bVar2 = NumberUtilities::IsFinite(dbl);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/DateImplementation.cpp"
                                ,0xe,"(Js::NumberUtilities::IsFinite(dbl))",
                                "Js::NumberUtilities::IsFinite(dbl)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  puVar4 = NumberUtilities::LuHiDbl(&local_18);
  if ((int)*puVar4 < 0) {
    puVar4 = NumberUtilities::LuHiDbl(&local_18);
    *(byte *)((long)puVar4 + 3) = *(byte *)((long)puVar4 + 3) & 0x7f;
    auVar5 = roundsd(extraout_XMM0_00,local_18,9);
    local_18 = auVar5._0_8_;
    puVar4 = NumberUtilities::LuHiDbl(&local_18);
    *(byte *)((long)puVar4 + 3) = *(byte *)((long)puVar4 + 3) | 0x80;
  }
  else {
    auVar5 = roundsd(extraout_XMM0,local_18,9);
    local_18 = auVar5._0_8_;
    puVar4 = NumberUtilities::LuHiDbl(&local_18);
    *(byte *)((long)puVar4 + 3) = *(byte *)((long)puVar4 + 3) & 0x7f;
  }
  return local_18;
}

Assistant:

static double ConvertToInteger(double dbl)
    {
        Assert(Js::NumberUtilities::IsFinite(dbl));
        if (Js::NumberUtilities::LuHiDbl(dbl) & 0x80000000)
        {
            Js::NumberUtilities::LuHiDbl(dbl) &= 0x7FFFFFFF;
            dbl = floor(dbl);
            Js::NumberUtilities::LuHiDbl(dbl) |= 0x80000000;
        }
        else
        {
            dbl = floor(dbl);
            // We have to do this because some implementations map 0.5 to -0.
            Js::NumberUtilities::LuHiDbl(dbl) &= 0x7FFFFFFF;
        }
        return dbl;
    }